

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void sha256_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  undefined1 local_98 [8];
  SHA256_CTX copy;
  sha256_context_t *ctx;
  ptls_hash_final_mode_t mode_local;
  void *md_local;
  ptls_hash_context_t *_ctx_local;
  
  copy._104_8_ = _ctx;
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    memcpy(local_98,_ctx + 1,0x70);
    SHA256_Final((uchar *)md,(SHA256_CTX *)local_98);
    (*ptls_clear_memory)(local_98,0x70);
  }
  else {
    if (md != (void *)0x0) {
      SHA256_Final((uchar *)md,(SHA256_CTX *)(_ctx + 1));
    }
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)((void *)(copy._104_8_ + 0x10),0x70);
      free((void *)copy._104_8_);
    }
    else {
      if (mode != PTLS_HASH_FINAL_MODE_RESET) {
        __assert_fail("!\"FIXME\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/openssl.c"
                      ,0x1fe,
                      "void sha256_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
      }
      SHA256_Init((SHA256_CTX *)(copy._104_8_ + 0x10));
    }
  }
  return;
}

Assistant:

static void sha256_final(ptls_hash_context_t *_ctx, void *md, ptls_hash_final_mode_t mode)
{
    struct sha256_context_t *ctx = (struct sha256_context_t *)_ctx;

    if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
        SHA256_CTX copy = ctx->ctx;
        SHA256_Final(md, &copy);
        ptls_clear_memory(&copy, sizeof(copy));
        return;
    }

    if (md != NULL)
        SHA256_Final(md, &ctx->ctx);

    switch (mode) {
    case PTLS_HASH_FINAL_MODE_FREE:
        ptls_clear_memory(&ctx->ctx, sizeof(ctx->ctx));
        free(ctx);
        break;
    case PTLS_HASH_FINAL_MODE_RESET:
        SHA256_Init(&ctx->ctx);
        break;
    default:
        assert(!"FIXME");
        break;
    }
}